

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

bool leveldb::ParseFileName(string *filename,uint64_t *number,FileType *type)

{
  bool bVar1;
  FileType FVar2;
  uint64_t num;
  size_t sStack_60;
  Slice rest;
  uint64_t num_1;
  Slice local_38;
  Slice local_28;
  
  rest.data_ = (filename->_M_dataplus)._M_p;
  rest.size_ = filename->_M_string_length;
  num = (long)"/CURRENT" + 1;
  sStack_60 = 7;
  bVar1 = operator==(&rest,(Slice *)&num);
  if (bVar1) {
    *number = 0;
    *type = kCurrentFile;
    return true;
  }
  num = (long)"/LOCK" + 1;
  sStack_60 = 4;
  bVar1 = operator==(&rest,(Slice *)&num);
  if (bVar1) {
    *number = 0;
    *type = kDBLockFile;
    return true;
  }
  num = (long)"/LOG" + 1;
  sStack_60 = 3;
  bVar1 = operator==(&rest,(Slice *)&num);
  if (bVar1) {
LAB_00118a50:
    *number = 0;
    *type = kInfoLogFile;
    return true;
  }
  local_38.data_ = "LOG.old";
  local_38.size_ = 7;
  bVar1 = operator==(&rest,&local_38);
  if (bVar1) goto LAB_00118a50;
  num = (uint64_t)anon_var_dwarf_4e3f8;
  sStack_60 = 9;
  bVar1 = Slice::starts_with(&rest,(Slice *)&num);
  if (bVar1) {
    Slice::remove_prefix(&rest,9);
    bVar1 = ConsumeDecimalNumber(&rest,&num);
    if ((!bVar1) || (rest.size_ != 0)) {
      return false;
    }
    *type = kDescriptorFile;
    goto LAB_00118b5e;
  }
  bVar1 = ConsumeDecimalNumber(&rest,&num_1);
  if (!bVar1) {
    return false;
  }
  num = (uint64_t)rest.data_;
  sStack_60 = rest.size_;
  local_38.data_ = ".log";
  local_38.size_ = 4;
  bVar1 = operator==((Slice *)&num,&local_38);
  FVar2 = kLogFile;
  if (!bVar1) {
    local_38.data_ = ".sst";
    local_38.size_ = 4;
    bVar1 = operator==((Slice *)&num,&local_38);
    if (!bVar1) {
      local_28.data_ = ".ldb";
      local_28.size_ = 4;
      bVar1 = operator==((Slice *)&num,&local_28);
      if (!bVar1) {
        local_38.data_ = ".dbtmp";
        local_38.size_ = 6;
        bVar1 = operator==((Slice *)&num,&local_38);
        if (!bVar1) {
          return false;
        }
        FVar2 = kTempFile;
        goto LAB_00118b56;
      }
    }
    FVar2 = kTableFile;
  }
LAB_00118b56:
  *type = FVar2;
  num = num_1;
LAB_00118b5e:
  *number = num;
  return true;
}

Assistant:

bool ParseFileName(const std::string& filename, uint64_t* number,
                   FileType* type) {
  Slice rest(filename);
  if (rest == "CURRENT") {
    *number = 0;
    *type = kCurrentFile;
  } else if (rest == "LOCK") {
    *number = 0;
    *type = kDBLockFile;
  } else if (rest == "LOG" || rest == "LOG.old") {
    *number = 0;
    *type = kInfoLogFile;
  } else if (rest.starts_with("MANIFEST-")) {
    rest.remove_prefix(strlen("MANIFEST-"));
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    if (!rest.empty()) {
      return false;
    }
    *type = kDescriptorFile;
    *number = num;
  } else {
    // Avoid strtoull() to keep filename format independent of the
    // current locale
    uint64_t num;
    if (!ConsumeDecimalNumber(&rest, &num)) {
      return false;
    }
    Slice suffix = rest;
    if (suffix == Slice(".log")) {
      *type = kLogFile;
    } else if (suffix == Slice(".sst") || suffix == Slice(".ldb")) {
      *type = kTableFile;
    } else if (suffix == Slice(".dbtmp")) {
      *type = kTempFile;
    } else {
      return false;
    }
    *number = num;
  }
  return true;
}